

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void impl_GLSL_UseProgram(MOJOSHADER_glProgram *program)

{
  GLhandleARB local_2c;
  GLuint local_1c;
  MOJOSHADER_glProgram *program_local;
  
  if (ctx->have_opengl_2 == 0) {
    if (program == (MOJOSHADER_glProgram *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = program->handle;
    }
    (*ctx->glUseProgramObjectARB)(local_2c);
  }
  else {
    if (program == (MOJOSHADER_glProgram *)0x0) {
      local_1c = 0;
    }
    else {
      local_1c = program->handle;
    }
    (*ctx->glUseProgram)(local_1c);
  }
  return;
}

Assistant:

static void impl_GLSL_UseProgram(MOJOSHADER_glProgram *program)
{
    if (ctx->have_opengl_2)
        ctx->glUseProgram(program ? program->handle : 0);
    else
        ctx->glUseProgramObjectARB((GLhandleARB) (program ? program->handle : 0));
}